

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void GameLoop(Board *board)

{
  undefined8 in_RAX;
  ostream *poVar1;
  int x;
  int iVar2;
  undefined4 uStack_38;
  char choice;
  int frames;
  
  _uStack_38 = in_RAX;
  system("clear");
  Board::PrintBoard(board);
  while( true ) {
    while( true ) {
      while( true ) {
        std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x1060c0);
        std::istream::ignore((long)&std::cin,1000);
        std::operator<<((ostream *)&std::cout,
                        "(n)ext iteration / (s)pecify frames to advance, / e(x)it: ");
        std::operator>>((istream *)&std::cin,&choice);
        if (choice != 'n') break;
        Board::Tick(board);
        system("clear");
        Board::PrintBoard(board);
      }
      if (choice != 's') break;
      _uStack_38 = CONCAT44(1,uStack_38);
      std::operator<<((ostream *)&std::cout,"Enter the number of frames you would like to advance: "
                     );
      std::istream::operator>>((istream *)&std::cin,&frames);
      for (iVar2 = 0; iVar2 < frames; iVar2 = iVar2 + 1) {
        Board::Tick(board);
        system("clear");
        Board::PrintBoard(board);
        usleep(100000);
      }
    }
    if (choice == 'x') break;
    poVar1 = std::operator<<((ostream *)&std::cout,"Invalid selection. Please try again.");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void GameLoop(Board &board)
{
    system("clear");
    board.PrintBoard();
    bool exit = false;
    do
    {
        char choice;

        //Just in case the user entered extra/invalid input
        std::cin.clear();
        std::cin.ignore(1000, '\n');

        std::cout << "(n)ext iteration / (s)pecify frames to advance, / e(x)it: ";
        std::cin >> choice;
        switch(choice)
        {
            case 'n':
                board.Tick();
                system("clear");
                board.PrintBoard();
                break;
            case 's':
            {
                int frames = 1;
                std::cout << "Enter the number of frames you would like to advance: ";
                std::cin >> frames;
                for (int x = 0; x < frames; x++)
                {
                    board.Tick();
                    system("clear");
                    board.PrintBoard();
                    usleep(100000);
                }
                break;
            }
            case 'x':
                exit = true;
                break;
            default:
                std::cout << "Invalid selection. Please try again." << std::endl;
                break;
        }
    } while(!exit);
}